

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall Generators_Stratified3D_Test::TestBody(Generators_Stratified3D_Test *this)

{
  undefined1 auVar1 [16];
  float fVar2;
  char *message;
  char *in_R9;
  uint uVar3;
  uint uVar4;
  float fVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [56];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  Point3f PVar8;
  AssertionResult gtest_ar_;
  int count;
  AssertHelper local_f0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  float local_dc;
  Stratified3DIter __begin1;
  string local_b0;
  Stratified3DIter __end1;
  AssertionResult gtest_ar;
  
  count = 0;
  gtest_ar.success_ = false;
  gtest_ar._1_3_ = 4;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pbrt::detail::IndexingGenerator<pbrt::Stratified3D,_pbrt::detail::Stratified3DIter>::begin
            (&__begin1,
             (IndexingGenerator<pbrt::Stratified3D,_pbrt::detail::Stratified3DIter> *)&gtest_ar);
  pbrt::detail::IndexingGenerator<pbrt::Stratified3D,_pbrt::detail::Stratified3DIter>::end
            (&__end1,(IndexingGenerator<pbrt::Stratified3D,_pbrt::detail::Stratified3DIter> *)
                     &gtest_ar);
  uVar4 = 0;
  do {
    auVar7 = in_ZMM0._8_56_;
    if (__begin1.super_RNGIterator<pbrt::detail::Stratified3DIter>.
        super_IndexingIterator<pbrt::detail::Stratified3DIter>.i ==
        __end1.super_RNGIterator<pbrt::detail::Stratified3DIter>.
        super_IndexingIterator<pbrt::detail::Stratified3DIter>.i) {
      __begin1.super_RNGIterator<pbrt::detail::Stratified3DIter>.
      super_IndexingIterator<pbrt::detail::Stratified3DIter>.i = 0x400;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"nx * ny * nz","count",(int *)&__begin1,&count);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&__begin1);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&__end1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x48a,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&__end1,(Message *)&__begin1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__end1);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&__begin1);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      return;
    }
    PVar8 = pbrt::detail::Stratified3DIter::operator*(&__begin1);
    local_dc = PVar8.super_Tuple3<pbrt::Point3,_float>.z;
    auVar6._0_8_ = PVar8.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar6._8_56_ = auVar7;
    fVar5 = PVar8.super_Tuple3<pbrt::Point3,_float>.x;
    if ((float)(uVar4 & 3) * 0.25 <= fVar5) {
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      fVar2 = (float)((uVar4 & 3) + 1) * 0.25;
      gtest_ar_.success_ = fVar5 < fVar2;
      if (fVar2 <= fVar5) goto LAB_003547d8;
    }
    else {
      gtest_ar_.success_ = false;
LAB_003547d8:
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b0,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "u[0] >= Float(ix) / Float(nx) && u[0] < Float(ix + 1) / Float(nx)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x485,local_b0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      std::__cxx11::string::~string((string *)&local_b0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_e8);
    }
    uVar3 = uVar4 >> 2 & 0x1f;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    auVar1 = vmovshdup_avx(auVar6._0_16_);
    fVar5 = auVar1._0_4_;
    if ((float)uVar3 * 0.03125 <= fVar5) {
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      fVar2 = (float)(uVar3 + 1) * 0.03125;
      gtest_ar_.success_ = fVar5 < fVar2;
      if (fVar2 <= fVar5) goto LAB_0035489a;
    }
    else {
      gtest_ar_.success_ = false;
LAB_0035489a:
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b0,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "u[1] >= Float(iy) / Float(ny) && u[1] < Float(iy + 1) / Float(ny)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x486,local_b0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      std::__cxx11::string::~string((string *)&local_b0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_e8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    if ((float)(uVar4 >> 7) * 0.125 <= local_dc) {
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      fVar5 = (float)((uVar4 >> 7) + 1) * 0.125;
      in_ZMM0 = ZEXT464((uint)fVar5);
      gtest_ar_.success_ = local_dc < fVar5;
      if (fVar5 <= local_dc) goto LAB_00354956;
    }
    else {
      gtest_ar_.success_ = false;
LAB_00354956:
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b0,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "u[2] >= Float(iz) / Float(nz) && u[2] < Float(iz + 1) / Float(nz)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x487,local_b0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      in_ZMM0._0_8_ = std::__cxx11::string::~string((string *)&local_b0);
      in_ZMM0._8_56_ = extraout_var;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_e8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    uVar4 = uVar4 + 1;
    __begin1.super_RNGIterator<pbrt::detail::Stratified3DIter>.
    super_IndexingIterator<pbrt::detail::Stratified3DIter>.i =
         __begin1.super_RNGIterator<pbrt::detail::Stratified3DIter>.
         super_IndexingIterator<pbrt::detail::Stratified3DIter>.i + 1;
    count = uVar4;
  } while( true );
}

Assistant:

TEST(Generators, Stratified3D) {
    int count = 0, nx = 4, ny = 32, nz = 8;  // power of 2
    for (Point3f u : Stratified3D(nx, ny, nz)) {
        int ix = count % nx;
        int iy = (count / nx) % ny;
        int iz = count / (nx * ny);
        EXPECT_TRUE(u[0] >= Float(ix) / Float(nx) && u[0] < Float(ix + 1) / Float(nx));
        EXPECT_TRUE(u[1] >= Float(iy) / Float(ny) && u[1] < Float(iy + 1) / Float(ny));
        EXPECT_TRUE(u[2] >= Float(iz) / Float(nz) && u[2] < Float(iz + 1) / Float(nz));
        ++count;
    }
    EXPECT_EQ(nx * ny * nz, count);
}